

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O1

void StartREST(any *context)

{
  undefined8 *puVar1;
  long lVar2;
  long in_FS_OFFSET;
  anon_class_32_2_05f9280c handler;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  allocator<char> local_81;
  code *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 *local_60;
  _Arg local_58 [2];
  _Arg local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = 0;
  do {
    local_78 = 0;
    if (context->_M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      local_80 = (code *)0x0;
    }
    else {
      local_58[0]._M_obj = &local_80;
      (*context->_M_manager)(_Op_clone,context,local_58);
    }
    puVar1 = (undefined8 *)((long)&uri_prefixes[0].prefix + lVar2);
    local_70 = *puVar1;
    uStack_68 = *(undefined8 *)((long)&uri_prefixes[0].handler + lVar2);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,(char *)*puVar1,&local_81)
    ;
    local_98 = (code *)0x0;
    pcStack_90 = (code *)0x0;
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    puVar1 = (undefined8 *)operator_new(0x20);
    puVar1[1] = 0;
    if (local_80 == (code *)0x0) {
      *puVar1 = 0;
    }
    else {
      local_60 = puVar1;
      (*local_80)(2,&local_80,&local_60);
    }
    puVar1[2] = local_70;
    puVar1[3] = uStack_68;
    pcStack_90 = std::
                 _Function_handler<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rest.cpp:1030:24)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<bool_(HTTPRequest_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rest.cpp:1030:24)>
               ::_M_manager;
    local_a8._M_unused._M_object = puVar1;
    RegisterHTTPHandler((string *)local_58,false,(HTTPRequestHandler *)&local_a8);
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
    if ((_Arg *)local_58[0]._M_obj != local_58 + 2) {
      operator_delete(local_58[0]._M_obj,(long)local_48[0] + 1);
    }
    if (local_80 != (code *)0x0) {
      (*local_80)(3,&local_80,0);
      local_80 = (code *)0x0;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0xc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StartREST(const std::any& context)
{
    for (const auto& up : uri_prefixes) {
        auto handler = [context, up](HTTPRequest* req, const std::string& prefix) { return up.handler(context, req, prefix); };
        RegisterHTTPHandler(up.prefix, false, handler);
    }
}